

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auStack_d8 [8];
  fd_set fds;
  timeval tv;
  GLFWbool local_38;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  iVar10 = _glfw.linjs.inotify;
  if (_glfw.linjs.inotify <= iVar1) {
    iVar10 = iVar1;
  }
  iVar3 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  do {
    while( true ) {
      fds.__fds_bits[0xd] = 0;
      fds.__fds_bits[0xe] = 0;
      fds.__fds_bits[0xb] = 0;
      fds.__fds_bits[0xc] = 0;
      fds.__fds_bits[9] = 0;
      fds.__fds_bits[10] = 0;
      fds.__fds_bits[7] = 0;
      fds.__fds_bits[8] = 0;
      fds.__fds_bits[5] = 0;
      fds.__fds_bits[6] = 0;
      fds.__fds_bits[3] = 0;
      fds.__fds_bits[4] = 0;
      fds.__fds_bits[1] = 0;
      fds.__fds_bits[2] = 0;
      auStack_d8 = (undefined1  [8])0x0;
      fds.__fds_bits[0] = 0;
      fds.__fds_bits[(long)(iVar3 >> 6) + -1] =
           fds.__fds_bits[(long)(iVar3 >> 6) + -1] | 1L << ((byte)iVar1 & 0x3f);
      if (0 < _glfw.linjs.inotify) {
        fds.__fds_bits[(ulong)((uint)_glfw.linjs.inotify >> 6) - 1] =
             fds.__fds_bits[(ulong)((uint)_glfw.linjs.inotify >> 6) - 1] |
             1L << ((byte)_glfw.linjs.inotify & 0x3f);
      }
      if (timeout == (double *)0x0) break;
      fds.__fds_bits[0xf] = (__fd_mask)*timeout;
      uVar7 = _glfwPlatformGetTimerValue();
      iVar5 = select(iVar10 + 1,(fd_set *)auStack_d8,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)(fds.__fds_bits + 0xf));
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      uVar8 = _glfwPlatformGetTimerValue();
      lVar9 = uVar8 - uVar7;
      auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = 0x45300000;
      uVar7 = _glfwPlatformGetTimerFrequency();
      auVar13._8_4_ = (int)(uVar7 >> 0x20);
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = 0x45300000;
      dVar11 = *timeout -
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
      *timeout = dVar11;
      if (iVar5 < 1) {
        bVar2 = 0.0 < dVar11 && (iVar4 != 4 || iVar5 != -1);
        if (0.0 >= dVar11 || iVar4 == 4 && iVar5 == -1) {
          local_38 = 0;
        }
      }
      else {
        local_38 = 1;
        bVar2 = false;
      }
      if (!bVar2) {
        return local_38;
      }
    }
    iVar4 = select(iVar10 + 1,(fd_set *)auStack_d8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar4 != -1) {
      return 1;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  return 1;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}